

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

bool walkModelAndPipeline
               (Model *model,function<bool_(const_CoreML::Specification::Model_&)> *handler)

{
  uint32_t uVar1;
  StringVector *pSVar2;
  Model *pMVar3;
  Rep *pRVar4;
  bool bVar5;
  undefined1 *puVar6;
  undefined8 uVar7;
  InternalMetadata *pIVar8;
  void **ppvVar9;
  long lVar10;
  long lVar11;
  _Any_data local_90;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  uVar1 = model->_oneof_case_[0];
  if (uVar1 == 200) {
    puVar6 = (undefined1 *)((model->Type_).pipelineclassifier_)->pipeline_;
    if ((Pipeline *)puVar6 == (Pipeline *)0x0) {
      puVar6 = CoreML::Specification::_Pipeline_default_instance_;
    }
    pRVar4 = (((Pipeline *)puVar6)->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar4->elements;
    if (pRVar4 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    lVar11 = (long)(((Pipeline *)puVar6)->models_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar11 != 0) {
      lVar10 = 0;
      do {
        pMVar3 = *(Model **)((long)ppvVar9 + lVar10);
        std::function<bool_(const_CoreML::Specification::Model_&)>::function
                  ((function<bool_(const_CoreML::Specification::Model_&)> *)&local_90,handler);
        bVar5 = walkModelAndPipeline
                          (pMVar3,(function<bool_(const_CoreML::Specification::Model_&)> *)&local_90
                          );
        if (local_80 != (code *)0x0) {
          (*local_80)(&local_90,&local_90,__destroy_functor);
        }
        if (bVar5) {
          return true;
        }
        lVar10 = lVar10 + 8;
      } while (lVar11 * 8 != lVar10);
    }
  }
  else if (uVar1 == 0xc9) {
    puVar6 = (undefined1 *)((model->Type_).pipelineclassifier_)->pipeline_;
    if ((Pipeline *)puVar6 == (Pipeline *)0x0) {
      puVar6 = CoreML::Specification::_Pipeline_default_instance_;
    }
    pRVar4 = (((Pipeline *)puVar6)->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar4->elements;
    if (pRVar4 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    lVar11 = (long)(((Pipeline *)puVar6)->models_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar11 != 0) {
      lVar10 = 0;
      do {
        pMVar3 = *(Model **)((long)ppvVar9 + lVar10);
        std::function<bool_(const_CoreML::Specification::Model_&)>::function
                  ((function<bool_(const_CoreML::Specification::Model_&)> *)&local_70,handler);
        bVar5 = walkModelAndPipeline
                          (pMVar3,(function<bool_(const_CoreML::Specification::Model_&)> *)&local_70
                          );
        if (local_60 != (code *)0x0) {
          (*local_60)(&local_70,&local_70,__destroy_functor);
        }
        if (bVar5) {
          return true;
        }
        lVar10 = lVar10 + 8;
      } while (lVar11 * 8 != lVar10);
    }
  }
  else if (uVar1 == 0xca) {
    pSVar2 = (((model->Type_).treeensembleclassifier_)->ClassLabels_).stringclasslabels_;
    pIVar8 = &(pSVar2->super_MessageLite)._internal_metadata_;
    if (pSVar2 == (StringVector *)0x0) {
      pIVar8 = (InternalMetadata *)0x0;
    }
    lVar11 = (long)((model->Type_).treeensembleclassifier_)->postevaluationtransform_;
    if (lVar11 != 0) {
      lVar10 = 0;
      do {
        pMVar3 = *(Model **)((long)&pIVar8->ptr_ + lVar10);
        std::function<bool_(const_CoreML::Specification::Model_&)>::function
                  ((function<bool_(const_CoreML::Specification::Model_&)> *)&local_50,handler);
        bVar5 = walkModelAndPipeline
                          (pMVar3,(function<bool_(const_CoreML::Specification::Model_&)> *)&local_50
                          );
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
        if (bVar5) {
          return true;
        }
        lVar10 = lVar10 + 8;
      } while (lVar11 * 8 != lVar10);
    }
  }
  if ((handler->super__Function_base)._M_manager == (_Manager_type)0x0) {
    uVar7 = std::__throw_bad_function_call();
    __clang_call_terminate(uVar7);
  }
  bVar5 = (*handler->_M_invoker)((_Any_data *)handler,model);
  return bVar5;
}

Assistant:

static bool walkModelAndPipeline(const Specification::Model &model,
                                 std::function<bool(const Specification::Model& m)> handler) {
    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                if (walkModelAndPipeline(m, handler)) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                if (walkModelAndPipeline(m, handler)) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                if (walkModelAndPipeline(m, handler)) {
                    return true;
                }
            }
            break;
        default:
            break;
    }
    if (handler(model)) {
        return true;
    }
    return false;
}